

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O1

bool anon_unknown.dwarf_e4ae9::checkPixels<unsigned_int>
               (Array2D<unsigned_int> *ph,int width,int height)

{
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  bVar10 = height < 1;
  if (0 < height) {
    lVar7 = 1;
    lVar8 = 0;
    uVar5 = 0;
    bVar10 = false;
    do {
      if (0 < width) {
        uVar6 = ((int)uVar5 * width) % 0x801;
        if (ph->_data[ph->_sizeY * uVar5] == uVar6) {
          lVar9 = 0;
          do {
            lVar4 = lVar9;
            if ((ulong)(uint)width - 1 == lVar4) goto LAB_0014b071;
            uVar6 = ((int)lVar4 + (int)lVar7) % 0x801;
            lVar9 = lVar4 + 1;
          } while (*(uint *)((long)ph->_data + lVar4 * 4 + ph->_sizeY * lVar8 + 4) == uVar6);
          bVar1 = width + -1 <= lVar4;
        }
        else {
          lVar9 = 0;
          bVar1 = false;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", should be ",0xc);
        plVar3 = (long *)std::ostream::operator<<(poVar2,uVar6);
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        std::ostream::put((char)plVar3);
        std::ostream::flush();
        std::ostream::flush();
        if (!bVar1) {
          return bVar10;
        }
      }
LAB_0014b071:
      bVar10 = height - 1 <= uVar5;
      uVar5 = uVar5 + 1;
      lVar8 = lVar8 + 4;
      lVar7 = lVar7 + (ulong)(uint)width;
    } while (uVar5 != (uint)height);
  }
  return bVar10;
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int width, int height)
{
    return checkPixels<T> (ph, 0, width - 1, 0, height - 1, width);
}